

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void google::protobuf::anon_unknown_15::ByteSizeConsistencyError
               (size_t byte_size_before_serialization,size_t byte_size_after_serialization,
               size_t bytes_produced_by_serialization,MessageLite *message)

{
  char *pcVar1;
  LogMessage *pLVar2;
  LogMessage local_d0;
  Voidify local_b9;
  string_view local_b8;
  LogMessage local_a8;
  Voidify local_91;
  unsigned_long local_90;
  unsigned_long local_88;
  Nullable<const_char_*> local_80;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  string_view local_68;
  LogMessage local_58;
  Voidify local_41;
  unsigned_long local_40;
  unsigned_long local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  MessageLite *message_local;
  size_t bytes_produced_by_serialization_local;
  size_t byte_size_after_serialization_local;
  size_t byte_size_before_serialization_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)message;
  message_local = (MessageLite *)bytes_produced_by_serialization;
  bytes_produced_by_serialization_local = byte_size_after_serialization;
  byte_size_after_serialization_local = byte_size_before_serialization;
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue(byte_size_before_serialization)
  ;
  local_40 = absl::lts_20250127::log_internal::GetReferenceableValue
                       (bytes_produced_by_serialization_local);
  local_30 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                       (&local_38,&local_40,
                        "byte_size_before_serialization == byte_size_after_serialization");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0xa8,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    local_68 = MessageLite::GetTypeName((MessageLite *)absl_log_internal_check_op_result);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,local_68);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [49])" was modified concurrently during serialization.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  local_88 = absl::lts_20250127::log_internal::GetReferenceableValue((unsigned_long)message_local);
  local_90 = absl::lts_20250127::log_internal::GetReferenceableValue
                       (byte_size_after_serialization_local);
  local_80 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                       (&local_88,&local_90,
                        "bytes_produced_by_serialization == byte_size_before_serialization");
  if (local_80 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_80);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0xab,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [155])
                               "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
                       );
    local_b8 = MessageLite::GetTypeName((MessageLite *)absl_log_internal_check_op_result);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,local_b8);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x79fdf5)
    ;
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a8);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0xb0);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d0);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [53])"This shouldn\'t be called if all the sizes are equal.")
  ;
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_b9,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_d0);
}

Assistant:

void ByteSizeConsistencyError(size_t byte_size_before_serialization,
                              size_t byte_size_after_serialization,
                              size_t bytes_produced_by_serialization,
                              const MessageLite& message) {
  ABSL_CHECK_EQ(byte_size_before_serialization, byte_size_after_serialization)
      << message.GetTypeName()
      << " was modified concurrently during serialization.";
  ABSL_CHECK_EQ(bytes_produced_by_serialization, byte_size_before_serialization)
      << "Byte size calculation and serialization were inconsistent.  This "
         "may indicate a bug in protocol buffers or it may be caused by "
         "concurrent modification of "
      << message.GetTypeName() << ".";
  ABSL_LOG(FATAL) << "This shouldn't be called if all the sizes are equal.";
}